

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int impliesNotNullRow(Walker *pWalker,Expr *pExpr)

{
  char *pcVar1;
  char *pcVar2;
  Walker *pWalker_00;
  byte *in_RSI;
  long in_RDI;
  Expr *pRight;
  Expr *pLeft;
  Expr *in_stack_ffffffffffffffc8;
  int local_4;
  
  if ((*(uint *)(in_RSI + 4) & 1) == 0) {
    if (((*(uint *)(in_RSI + 4) & 2) == 0) || (*(short *)(in_RDI + 0x26) == 0)) {
      pWalker_00 = (Walker *)(ulong)(*in_RSI - 0x2b);
      switch(pWalker_00) {
      case (Walker *)0x0:
      case (Walker *)0x1:
        bothImplyNotNullRow(pWalker_00,in_stack_ffffffffffffffc8,(Expr *)0x1d196d);
        local_4 = 1;
        break;
      case (Walker *)0x2:
      case (Walker *)0x3:
      case (Walker *)0x8:
      case (Walker *)0x9:
      case (Walker *)0x73:
      case (Walker *)0x81:
      case (Walker *)0x84:
      case (Walker *)0x86:
        local_4 = 1;
        break;
      case (Walker *)0x6:
        sqlite3WalkExpr(pWalker_00,in_stack_ffffffffffffffc8);
        bothImplyNotNullRow(pWalker_00,in_stack_ffffffffffffffc8,(Expr *)0x1d19f1);
        local_4 = 1;
        break;
      case (Walker *)0x7:
        if (((*(uint *)(in_RSI + 4) & 0x1000) == 0) && (0 < **(int **)(in_RSI + 0x20))) {
          sqlite3WalkExpr(pWalker_00,in_stack_ffffffffffffffc8);
        }
        local_4 = 1;
        break;
      case (Walker *)0xa:
      case (Walker *)0xb:
      case (Walker *)0xc:
      case (Walker *)0xd:
      case (Walker *)0xe:
      case (Walker *)0xf:
        pcVar1 = *(char **)(in_RSI + 0x10);
        pcVar2 = *(char **)(in_RSI + 0x18);
        if ((((*pcVar1 == -0x58) && (*(long *)(pcVar1 + 0x40) != 0)) &&
            (*(char *)(*(long *)(pcVar1 + 0x40) + 0x3f) == '\x01')) ||
           (((*pcVar2 == -0x58 && (*(long *)(pcVar2 + 0x40) != 0)) &&
            (*(char *)(*(long *)(pcVar2 + 0x40) + 0x3f) == '\x01')))) {
          return 1;
        }
      default:
        local_4 = 0;
        break;
      case (Walker *)0x7d:
        if (*(int *)(in_RDI + 0x28) == *(int *)(in_RSI + 0x2c)) {
          *(undefined2 *)(in_RDI + 0x24) = 1;
          local_4 = 2;
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int impliesNotNullRow(Walker *pWalker, Expr *pExpr){
  testcase( pExpr->op==TK_AGG_COLUMN );
  testcase( pExpr->op==TK_AGG_FUNCTION );
  if( ExprHasProperty(pExpr, EP_OuterON) ) return WRC_Prune;
  if( ExprHasProperty(pExpr, EP_InnerON) && pWalker->mWFlags ){
    /* If iCur is used in an inner-join ON clause to the left of a
    ** RIGHT JOIN, that does *not* mean that the table must be non-null.
    ** But it is difficult to check for that condition precisely.
    ** To keep things simple, any use of iCur from any inner-join is
    ** ignored while attempting to simplify a RIGHT JOIN. */
    return WRC_Prune;
  }
  switch( pExpr->op ){
    case TK_ISNOT:
    case TK_ISNULL:
    case TK_NOTNULL:
    case TK_IS:
    case TK_VECTOR:
    case TK_FUNCTION:
    case TK_TRUTH:
    case TK_CASE:
      testcase( pExpr->op==TK_ISNOT );
      testcase( pExpr->op==TK_ISNULL );
      testcase( pExpr->op==TK_NOTNULL );
      testcase( pExpr->op==TK_IS );
      testcase( pExpr->op==TK_VECTOR );
      testcase( pExpr->op==TK_FUNCTION );
      testcase( pExpr->op==TK_TRUTH );
      testcase( pExpr->op==TK_CASE );
      return WRC_Prune;

    case TK_COLUMN:
      if( pWalker->u.iCur==pExpr->iTable ){
        pWalker->eCode = 1;
        return WRC_Abort;
      }
      return WRC_Prune;

    case TK_OR:
    case TK_AND:
      /* Both sides of an AND or OR must separately imply non-null-row.
      ** Consider these cases:
      **    1.  NOT (x AND y)
      **    2.  x OR y
      ** If only one of x or y is non-null-row, then the overall expression
      ** can be true if the other arm is false (case 1) or true (case 2).
      */
      testcase( pExpr->op==TK_OR );
      testcase( pExpr->op==TK_AND );
      bothImplyNotNullRow(pWalker, pExpr->pLeft, pExpr->pRight);
      return WRC_Prune;

    case TK_IN:
      /* Beware of "x NOT IN ()" and "x NOT IN (SELECT 1 WHERE false)",
      ** both of which can be true.  But apart from these cases, if
      ** the left-hand side of the IN is NULL then the IN itself will be
      ** NULL. */
      if( ExprUseXList(pExpr) && ALWAYS(pExpr->x.pList->nExpr>0) ){
        sqlite3WalkExpr(pWalker, pExpr->pLeft);
      }
      return WRC_Prune;

    case TK_BETWEEN:
      /* In "x NOT BETWEEN y AND z" either x must be non-null-row or else
      ** both y and z must be non-null row */
      assert( ExprUseXList(pExpr) );
      assert( pExpr->x.pList->nExpr==2 );
      sqlite3WalkExpr(pWalker, pExpr->pLeft);
      bothImplyNotNullRow(pWalker, pExpr->x.pList->a[0].pExpr,
                                   pExpr->x.pList->a[1].pExpr);
      return WRC_Prune;

    /* Virtual tables are allowed to use constraints like x=NULL.  So
    ** a term of the form x=y does not prove that y is not null if x
    ** is the column of a virtual table */
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      Expr *pLeft = pExpr->pLeft;
      Expr *pRight = pExpr->pRight;
      testcase( pExpr->op==TK_EQ );
      testcase( pExpr->op==TK_NE );
      testcase( pExpr->op==TK_LT );
      testcase( pExpr->op==TK_LE );
      testcase( pExpr->op==TK_GT );
      testcase( pExpr->op==TK_GE );
      /* The y.pTab=0 assignment in wherecode.c always happens after the
      ** impliesNotNullRow() test */
      assert( pLeft->op!=TK_COLUMN || ExprUseYTab(pLeft) );
      assert( pRight->op!=TK_COLUMN || ExprUseYTab(pRight) );
      if( (pLeft->op==TK_COLUMN
           && ALWAYS(pLeft->y.pTab!=0)
           && IsVirtual(pLeft->y.pTab))
       || (pRight->op==TK_COLUMN
           && ALWAYS(pRight->y.pTab!=0)
           && IsVirtual(pRight->y.pTab))
      ){
        return WRC_Prune;
      }
      /* no break */ deliberate_fall_through
    }
    default:
      return WRC_Continue;
  }
}